

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  KeyValue *pKVar1;
  MessageLite *pMVar2;
  EpsCopyOutputStream *pEVar3;
  MessageLite *extendee_00;
  EpsCopyOutputStream *stream_00;
  KeyValue *pKVar4;
  KeyValue *this_00;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  iterator iVar9;
  iterator iVar10;
  uint8_t *local_68;
  MessageLite *local_60;
  EpsCopyOutputStream *local_58;
  uint8_t **local_50;
  MessageLite *pMStack_48;
  EpsCopyOutputStream *local_40;
  ExtensionSet *pEStack_38;
  
  local_50 = &local_68;
  lVar5 = (long)(short)this->flat_size_;
  this_00 = (this->map_).flat;
  local_68 = target;
  pMStack_48 = extendee;
  local_40 = stream;
  pEStack_38 = this;
  if (lVar5 < 0) {
    iVar9 = absl::lts_20250127::container_internal::
            btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)this_00);
    iVar10 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)(this->map_).flat);
    ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              (iVar9.node_,iVar9.position_,iVar10.node_,iVar10._8_8_ & 0xffffffff);
  }
  else {
    lVar6 = lVar5 * 0x20;
    pKVar1 = this_00 + lVar5;
    pKVar4 = this_00;
    pMVar2 = extendee;
    pEVar3 = stream;
    local_58 = stream;
    local_60 = extendee;
    if (this->flat_size_ != 0) {
      uVar7 = 0;
      do {
        lVar6 = lVar6 + -0x20;
        Extension::PrefetchPtr(&pKVar4->second);
        pKVar4 = pKVar4 + 1;
        pMVar2 = local_60;
        pEVar3 = local_58;
        if (lVar6 == 0) break;
        bVar8 = uVar7 < 0xf;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
    for (; stream_00 = local_58, extendee_00 = local_60, local_60 = pMVar2, local_58 = pEVar3,
        pKVar4 != pKVar1; pKVar4 = pKVar4 + 1) {
      local_68 = Extension::InternalSerializeMessageSetItemWithCachedSizesToArray
                           (&this_00->second,extendee_00,this,this_00->first,local_68,stream_00);
      Extension::PrefetchPtr(&pKVar4->second);
      this_00 = this_00 + 1;
      pMVar2 = local_60;
      pEVar3 = local_58;
      local_58 = stream_00;
      local_60 = extendee_00;
    }
    for (; this_00 != pKVar1; this_00 = this_00 + 1) {
      local_68 = Extension::InternalSerializeMessageSetItemWithCachedSizesToArray
                           (&this_00->second,extendee_00,this,this_00->first,local_68,stream_00);
    }
  }
  return local_68;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const ExtensionSet* extension_set = this;
  ForEach(
      [&target, extendee, stream, extension_set](int number,
                                                 const Extension& ext) {
        target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
            extendee, extension_set, number, target, stream);
      },
      Prefetch{});
  return target;
}